

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

void __thiscall
despot::MemoryPool<despot::TigerState>::Free(MemoryPool<despot::TigerState> *this,TigerState *obj)

{
  pointer *pppTVar1;
  iterator __position;
  TigerState *local_10;
  
  local_10 = obj;
  if (obj->field_0x8 != '\0') {
    obj->field_0x8 = 0;
    __position._M_current =
         (this->freelist_).
         super__Vector_base<despot::TigerState_*,_std::allocator<despot::TigerState_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->freelist_).
        super__Vector_base<despot::TigerState_*,_std::allocator<despot::TigerState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<despot::TigerState*,std::allocator<despot::TigerState*>>::
      _M_realloc_insert<despot::TigerState*const&>
                ((vector<despot::TigerState*,std::allocator<despot::TigerState*>> *)&this->freelist_
                 ,__position,&local_10);
    }
    else {
      *__position._M_current = obj;
      pppTVar1 = &(this->freelist_).
                  super__Vector_base<despot::TigerState_*,_std::allocator<despot::TigerState_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    this->num_allocated_ = this->num_allocated_ + -1;
    return;
  }
  __assert_fail("obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x3b,
                "void despot::MemoryPool<despot::TigerState>::Free(T *) [T = despot::TigerState]");
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}